

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O2

void preconditioner_to_regularizer<dense_parameters>
               (vw *all,bfgs *b,float regularization,dense_parameters *weights)

{
  float fVar1;
  ulong uVar2;
  float *pfVar3;
  weight *pwVar4;
  vw_exception *this;
  byte bVar5;
  byte bVar6;
  weight *pwVar8;
  long lVar9;
  uint64_t uVar10;
  string local_1c0;
  stringstream __msg;
  ostream local_190;
  uint32_t uVar7;
  
  if (b->regularizers == (weight *)0x0) {
    pfVar3 = calloc_or_throw<float>((ulong)(uint)(2 << ((byte)all->num_bits & 0x1f)));
    b->regularizers = pfVar3;
    if (pfVar3 == (float *)0x0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<(&local_190,"Failed to allocate weight array: try decreasing -b <bits>");
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/bfgs.cc"
                 ,0x21a,&local_1c0);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    pwVar8 = weights->_begin;
    uVar7 = weights->_stride_shift;
    lVar9 = 0;
    pwVar4 = pwVar8;
    while( true ) {
      uVar10 = weights->_weight_mask;
      bVar6 = (byte)weights->_stride_shift;
      if ((weight *)((long)pwVar8 + lVar9) == pwVar4 + uVar10 + 1) break;
      uVar2 = (ulong)(lVar9 >> 2) >> (bVar6 & 0x3f);
      b->regularizers[uVar2 * 2] = regularization;
      fVar1 = *(float *)((long)pwVar8 + lVar9 + 0xc);
      if (0.0 < fVar1) {
        b->regularizers[uVar2 * 2] = 1.0 / fVar1 + b->regularizers[uVar2 * 2];
      }
      pwVar4 = weights->_begin;
      lVar9 = lVar9 + (1L << ((byte)uVar7 & 0x3f)) * 4;
    }
  }
  else {
    pwVar8 = weights->_begin;
    uVar7 = weights->_stride_shift;
    bVar5 = (byte)uVar7;
    pwVar4 = pwVar8;
    for (lVar9 = 0; bVar6 = (byte)uVar7, uVar10 = weights->_weight_mask,
        (weight *)((long)pwVar8 + lVar9) != pwVar4 + uVar10 + 1;
        lVar9 = lVar9 + (1L << (bVar5 & 0x3f)) * 4) {
      fVar1 = *(float *)((long)pwVar8 + lVar9 + 0xc);
      if (0.0 < fVar1) {
        uVar2 = (ulong)(lVar9 >> 2) >> (bVar6 & 0x3f);
        b->regularizers[uVar2 * 2] = 1.0 / fVar1 + b->regularizers[uVar2 * 2];
        pwVar4 = weights->_begin;
        uVar7 = weights->_stride_shift;
      }
    }
  }
  pwVar8 = pwVar4;
  for (lVar9 = 0; (weight *)((long)pwVar4 + lVar9) != pwVar8 + uVar10 + 1;
      lVar9 = lVar9 + (ulong)(uint)(1 << (bVar6 & 0x1f)) * 4) {
    b->regularizers[((ulong)(lVar9 >> 2) >> ((byte)weights->_stride_shift & 0x3f)) * 2 + 1] =
         *(weight *)((long)pwVar4 + lVar9);
    pwVar8 = weights->_begin;
    uVar10 = weights->_weight_mask;
  }
  return;
}

Assistant:

void preconditioner_to_regularizer(vw& all, bfgs& b, float regularization, T& weights)
{
  uint32_t length = 1 << all.num_bits;

  if (b.regularizers == nullptr)
  {
    b.regularizers = calloc_or_throw<weight>(2 * length);

    if (b.regularizers == nullptr)
      THROW("Failed to allocate weight array: try decreasing -b <bits>");

    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      uint64_t i = w.index() >> weights.stride_shift();
      b.regularizers[2 * i] = regularization;
      if ((&(*w))[W_COND] > 0.f)
        b.regularizers[2 * i] += 1.f / (&(*w))[W_COND];
    }
  }
  else
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      if ((&(*w))[W_COND] > 0.f)
        b.regularizers[2 * (w.index() >> weights.stride_shift())] += 1.f / (&(*w))[W_COND];
    }

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    b.regularizers[2 * (w.index() >> weights.stride_shift()) + 1] = *w;
}